

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::GenerateLookUpInIndexCache
          (Lowerer *this,Instr *instrInsert,RegOpnd *indexOpnd,RegOpnd *baseOpnd,
          RegOpnd *opndSlotArray,RegOpnd *opndSlotIndex,uint32 inlineCacheOffset,
          uint32 hitRateOffset,LabelInstr *labelHelper,FldInfoFlags flags)

{
  code *pcVar1;
  bool bVar2;
  RegOpnd *objectTypeOpnd;
  IndirOpnd *pIVar3;
  RegOpnd *pRVar4;
  undefined4 *puVar5;
  Type *ppBVar6;
  IntConstOpnd *src2;
  RegOpnd *local_80;
  RegOpnd *taggedTypeOpnd;
  RegOpnd *local_70;
  RegOpnd *local_68;
  RegOpnd *local_60;
  RegOpnd *local_58;
  LabelInstr *local_50;
  BranchInstr *local_48;
  BranchInstr *branchToPatch;
  LabelInstr *nextLabel;
  
  nextLabel._6_1_ = flags != FldInfo_NoInfo;
  nextLabel._0_4_ = (uint)flags;
  nextLabel._7_1_ = (~(uint)nextLabel & 0x21) != 0;
  nextLabel._5_1_ = (~(uint)nextLabel & 0x41) == 0 || flags == FldInfo_NoInfo;
  taggedTypeOpnd = indexOpnd;
  local_70 = opndSlotArray;
  local_68 = opndSlotIndex;
  LowererMD::GenerateObjectTest
            (&this->m_lowererMD,&baseOpnd->super_Opnd,instrInsert,labelHelper,false);
  objectTypeOpnd = IR::RegOpnd::New(TyUint64,this->m_func);
  local_60 = baseOpnd;
  pIVar3 = IR::IndirOpnd::New(baseOpnd,8,TyUint64,this->m_func,false);
  InsertMove(&objectTypeOpnd->super_Opnd,&pIVar3->super_Opnd,instrInsert,true);
  pRVar4 = IR::RegOpnd::New(TyUint64,this->m_func);
  pIVar3 = IR::IndirOpnd::New(taggedTypeOpnd,inlineCacheOffset,TyUint64,this->m_func,false);
  InsertMove(&pRVar4->super_Opnd,&pIVar3->super_Opnd,instrInsert,true);
  local_58 = pRVar4;
  GenerateDynamicLoadPolymorphicInlineCacheSlot(this,instrInsert,pRVar4,&objectTypeOpnd->super_Opnd)
  ;
  local_50 = IR::LabelInstr::New(Label,this->m_func,false);
  local_48 = (Type)0x0;
  branchToPatch = (BranchInstr *)0x0;
  local_80 = (RegOpnd *)0x0;
  if ((nextLabel._6_1_ & nextLabel._7_1_) == 0) {
    GenerateLookUpInIndexCacheHelper<true,true,false>
              (this,instrInsert,local_60,local_70,local_68,objectTypeOpnd,local_58,local_50,
               labelHelper,(LabelInstr **)&branchToPatch,&local_48,&local_80);
  }
  pRVar4 = local_70;
  if (nextLabel._5_1_ != '\0') {
    GenerateLookUpInIndexCacheHelper<true,false,false>
              (this,instrInsert,local_60,local_70,local_68,objectTypeOpnd,local_58,local_50,
               labelHelper,(LabelInstr **)&branchToPatch,&local_48,&local_80);
  }
  if (((uint)nextLabel & 2) != 0) {
    if (((uint)nextLabel & 0x20) != 0) {
      GenerateLookUpInIndexCacheHelper<false,true,false>
                (this,instrInsert,local_60,pRVar4,local_68,objectTypeOpnd,local_58,local_50,
                 labelHelper,(LabelInstr **)&branchToPatch,&local_48,&local_80);
    }
    if (((uint)nextLabel & 0x40) != 0) {
      GenerateLookUpInIndexCacheHelper<false,false,false>
                (this,instrInsert,local_60,pRVar4,local_68,objectTypeOpnd,local_58,local_50,
                 labelHelper,(LabelInstr **)&branchToPatch,&local_48,&local_80);
    }
  }
  if (((uint)nextLabel & 4) != 0) {
    if (pRVar4 == (RegOpnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x414e,"(opndSlotArray)","opndSlotArray");
      if (!bVar2) goto LAB_0057c876;
      *puVar5 = 0;
      pRVar4 = local_70;
    }
    if (((uint)nextLabel & 0x20) != 0) {
      GenerateLookUpInIndexCacheHelper<true,true,true>
                (this,instrInsert,local_60,pRVar4,local_68,objectTypeOpnd,local_58,local_50,
                 labelHelper,(LabelInstr **)&branchToPatch,&local_48,&local_80);
    }
    if (((uint)nextLabel & 0x40) != 0) {
      GenerateLookUpInIndexCacheHelper<true,false,true>
                (this,instrInsert,local_60,pRVar4,local_68,objectTypeOpnd,local_58,local_50,
                 labelHelper,(LabelInstr **)&branchToPatch,&local_48,&local_80);
    }
  }
  if (local_48 == (Type)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x416f,"(branchToPatch)","branchToPatch");
    if (!bVar2) goto LAB_0057c876;
    *puVar5 = 0;
  }
  if (branchToPatch == (BranchInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x4170,"(nextLabel)","nextLabel");
    if (!bVar2) goto LAB_0057c876;
    *puVar5 = 0;
  }
  if (*(int *)&branchToPatch->m_regContent == 1) {
    ppBVar6 = SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>::Head
                        ((SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount> *)
                         &branchToPatch->field_0x58);
    if (*ppBVar6 == local_48) goto LAB_0057c803;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar5 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x4171,
                     "(nextLabel->labelRefs.Count() == 1 && nextLabel->labelRefs.Head() == branchToPatch)"
                     ,
                     "nextLabel->labelRefs.Count() == 1 && nextLabel->labelRefs.Head() == branchToPatch"
                    );
  if (!bVar2) {
LAB_0057c876:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar5 = 0;
LAB_0057c803:
  IR::BranchInstr::SetTarget(local_48,labelHelper);
  IR::Instr::Remove(&branchToPatch->super_Instr);
  IR::Instr::InsertBefore(instrInsert,&local_50->super_Instr);
  pIVar3 = IR::IndirOpnd::New(taggedTypeOpnd,hitRateOffset,TyInt32,this->m_func,false);
  src2 = IR::IntConstOpnd::New(1,TyInt32,this->m_func,false);
  InsertAdd(false,&pIVar3->super_Opnd,&pIVar3->super_Opnd,&src2->super_Opnd,instrInsert);
  return;
}

Assistant:

void
Lowerer::GenerateLookUpInIndexCache(
    _In_ IR::Instr* instrInsert,
    _In_ IR::RegOpnd* indexOpnd,
    _In_ IR::RegOpnd* baseOpnd,
    _In_opt_ IR::RegOpnd* opndSlotArray,
    _In_opt_ IR::RegOpnd* opndSlotIndex,
    _In_ const uint32 inlineCacheOffset,
    _In_ const uint32 hitRateOffset,
    _In_ IR::LabelInstr* labelHelper,
    _In_ Js::FldInfoFlags flags) // = Js::FldInfo_NoInfo
{
    // Generates:
    //      MOV inlineCacheOpnd, index->inlineCache
    //      GenerateObjectTest(baseOpnd, $helper)         ; verify base is an object
    //      MOV objectTypeOpnd, baseOpnd->type
    //      GenerateDynamicLoadPolymorphicInlineCacheSlot(inlineCacheOpnd, objectTypeOpnd) ; loads inline cache for given type
    // if (checkLocalInlineSlots)
    //      GenerateLookUpInIndexCacheHelper<CheckLocal, CheckInlineSlot> // checks local inline slots, goes to next on failure
    // if (checkLocalAuxSlots)
    //      GenerateLookUpInIndexCacheHelper<CheckLocal, CheckAuxSlot> // checks local aux slots, goes to next on failure
    // if (fromProto && fromInlineSlots)
    //      GenerateLookUpInIndexCacheHelper<CheckProto, CheckInlineSlot> // checks proto inline slots, goes to next on failure
    // if (fromProto && fromAuxSlots)
    //      GenerateLookUpInIndexCacheHelper<CheckProto, CheckAuxSlot> // checks proto aux slots, goes to next on failure
    // if (doAdd && fromInlineSlots)
    //      GenerateLookUpInIndexCacheHelper<CheckLocal, CheckInlineSlot, DoAdd> // checks typeWithoutProperty inline slots, goes to next on failure
    // if (doAdd && fromAuxSlots)
    //      GenerateLookUpInIndexCacheHelper<CheckLocal, CheckAuxSlot, DoAdd> // checks typeWithoutProperty aux slots, goes to helper on failure
    // $slotIndexLoadedLabel
    //      INC indexOpnd->hitRate

    const bool fromInlineSlots = (flags & Js::FldInfo_FromInlineSlots) == Js::FldInfo_FromInlineSlots;
    const bool fromAuxSlots = (flags & Js::FldInfo_FromAuxSlots) == Js::FldInfo_FromAuxSlots;
    const bool fromLocal = (flags & Js::FldInfo_FromLocal) == Js::FldInfo_FromLocal;
    const bool fromProto = (flags & Js::FldInfo_FromProto) == Js::FldInfo_FromProto;
    const bool doAdd = (flags & Js::FldInfo_FromLocalWithoutProperty) == Js::FldInfo_FromLocalWithoutProperty;

    const bool checkLocalInlineSlots = flags == Js::FldInfo_NoInfo || (fromInlineSlots && fromLocal);
    const bool checkLocalAuxSlots = flags == Js::FldInfo_NoInfo || (fromAuxSlots && fromLocal);

    m_lowererMD.GenerateObjectTest(baseOpnd, instrInsert, labelHelper);

    IR::RegOpnd * objectTypeOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(objectTypeOpnd, IR::IndirOpnd::New(baseOpnd, Js::RecyclableObject::GetOffsetOfType(), TyMachPtr, m_func), instrInsert);

    IR::RegOpnd * inlineCacheOpnd = IR::RegOpnd::New(TyMachPtr, m_func);
    InsertMove(inlineCacheOpnd, IR::IndirOpnd::New(indexOpnd, inlineCacheOffset, TyMachPtr, m_func), instrInsert);

    GenerateDynamicLoadPolymorphicInlineCacheSlot(instrInsert, inlineCacheOpnd, objectTypeOpnd);

    IR::LabelInstr* slotIndexLoadedLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);

    IR::BranchInstr* branchToPatch = nullptr;
    IR::LabelInstr* nextLabel = nullptr;
    IR::RegOpnd* taggedTypeOpnd = nullptr;
    if (checkLocalInlineSlots)
    {
        GenerateLookUpInIndexCacheHelper<true /* CheckLocal */, true /* CheckInlineSlot */, false /* DoAdd */>(
            instrInsert,
            baseOpnd,
            opndSlotArray,
            opndSlotIndex,
            objectTypeOpnd,
            inlineCacheOpnd,
            slotIndexLoadedLabel,
            labelHelper,
            &nextLabel,
            &branchToPatch,
            &taggedTypeOpnd);
    }
    if (checkLocalAuxSlots)
    {
        GenerateLookUpInIndexCacheHelper<true /* CheckLocal */, false /* CheckInlineSlot */, false /* DoAdd */>(
            instrInsert,
            baseOpnd,
            opndSlotArray,
            opndSlotIndex,
            objectTypeOpnd,
            inlineCacheOpnd,
            slotIndexLoadedLabel,
            labelHelper,
            &nextLabel,
            &branchToPatch,
            &taggedTypeOpnd);
    }

    if (fromProto)
    {
        if (fromInlineSlots)
        {
            GenerateLookUpInIndexCacheHelper<false /* CheckLocal */, true /* CheckInlineSlot */, false /* DoAdd */>(
                instrInsert,
                baseOpnd,
                opndSlotArray,
                opndSlotIndex,
                objectTypeOpnd,
                inlineCacheOpnd,
                slotIndexLoadedLabel,
                labelHelper,
                &nextLabel,
                &branchToPatch,
                &taggedTypeOpnd);
        }
        if (fromAuxSlots)
        {
            GenerateLookUpInIndexCacheHelper<false /* CheckLocal */, false /* CheckInlineSlot */, false /* DoAdd */>(
                instrInsert,
                baseOpnd,
                opndSlotArray,
                opndSlotIndex,
                objectTypeOpnd,
                inlineCacheOpnd,
                slotIndexLoadedLabel,
                labelHelper,
                &nextLabel,
                &branchToPatch,
                &taggedTypeOpnd);
        }
    }
    if (doAdd)
    {
        Assert(opndSlotArray);

        if (fromInlineSlots)
        {
            GenerateLookUpInIndexCacheHelper<true /* CheckLocal */, true /* CheckInlineSlot */, true /* DoAdd */>(
                instrInsert,
                baseOpnd,
                opndSlotArray,
                opndSlotIndex,
                objectTypeOpnd,
                inlineCacheOpnd,
                slotIndexLoadedLabel,
                labelHelper,
                &nextLabel,
                &branchToPatch,
                &taggedTypeOpnd);
        }
        if (fromAuxSlots)
        {
            GenerateLookUpInIndexCacheHelper<true /* CheckLocal */, false /* CheckInlineSlot */, true /* DoAdd */>(
                instrInsert,
                baseOpnd,
                opndSlotArray,
                opndSlotIndex,
                objectTypeOpnd,
                inlineCacheOpnd,
                slotIndexLoadedLabel,
                labelHelper,
                &nextLabel,
                &branchToPatch,
                &taggedTypeOpnd);
        }
    }
    Assert(branchToPatch);
    Assert(nextLabel);
    Assert(nextLabel->labelRefs.Count() == 1 && nextLabel->labelRefs.Head() == branchToPatch);

    branchToPatch->SetTarget(labelHelper);
    nextLabel->Remove();

    instrInsert->InsertBefore(slotIndexLoadedLabel);

    IR::IndirOpnd * hitRateOpnd = IR::IndirOpnd::New(indexOpnd, hitRateOffset, TyInt32, m_func);
    IR::IntConstOpnd * incOpnd = IR::IntConstOpnd::New(1, TyInt32, m_func);
    // overflow check: not needed here, we don't allocate anything with hitrate
    InsertAdd(false, hitRateOpnd, hitRateOpnd, incOpnd, instrInsert);
}